

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O0

size_t wal_estimate_size(image_data im,int wal_type)

{
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_28;
  uint32_t size;
  uint32_t height;
  uint32_t width;
  size_t mip;
  size_t result;
  int wal_type_local;
  
  mip = 0;
  size = im.width;
  local_28 = im.height;
  if (wal_type == 1) {
    mip = 100;
    for (_height = 0; _height < 4; _height = _height + 1) {
      local_34 = size * local_28;
      if (local_34 == 0) {
        local_34 = 1;
      }
      mip = local_34 + mip;
      size = size >> 1;
      local_28 = local_28 >> 1;
    }
  }
  else if (wal_type == 2) {
    mip = 0x37c;
    for (_height = 0; _height < 9; _height = _height + 1) {
      local_38 = size * local_28;
      if (local_38 == 0) {
        local_38 = 1;
      }
      mip = local_38 + mip;
      size = size >> 1;
      local_28 = local_28 >> 1;
    }
  }
  return mip;
}

Assistant:

size_t wal_estimate_size(struct image_data im, int wal_type)
{
	size_t result = 0, mip = 0;
	uint32_t width = im.width, height = im.height, size = 0;
	switch (wal_type) {
		case WAL_TYPE_QUAKE2:
			result += WAL_Q2_HEADER_SIZE;
			for (mip = 0; mip < MIP_LEVELS_Q2; mip++) {
				size = width * height;
				result += size > 0 ? size : 1;
				width /= 2;
				height /= 2;
			}
			break;
		case WAL_TYPE_DAIKATANA:
			result += WAL_DK_HEADER_SIZE;
			for (mip = 0; mip < MIP_LEVELS_DK; mip++) {
				size = width * height;
				result += size > 0 ? size : 1;
				width /= 2;
				height /= 2;
			}
			break;
	}
	return result;
}